

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O2

void __thiscall ProcessProgress::parse(ProcessProgress *this,char *cmd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  ulonglong uVar6;
  uint32_t size;
  uint32_t size_00;
  ulong uVar7;
  SharedControlBlock *pSVar8;
  char *__format;
  char *end;
  epoll_data_t local_60;
  char buffer [64];
  
  iVar4 = strncmp(cmd,"CRASH",5);
  if (iVar4 == 0) {
    close_and_remove_epoll_entry(&this->timer_fd);
    iVar4 = timerfd_create(1,0x80000);
    this->timer_fd = iVar4;
    if (-1 < iVar4) {
      buffer[0x18] = '\0';
      buffer[0x19] = '\0';
      buffer[0x1a] = '\0';
      buffer[0x1b] = '\0';
      buffer[0x1c] = '\0';
      buffer[0x1d] = '\0';
      buffer[0x1e] = '\0';
      buffer[0x1f] = '\0';
      buffer[0] = '\0';
      buffer[1] = '\0';
      buffer[2] = '\0';
      buffer[3] = '\0';
      buffer[4] = '\0';
      buffer[5] = '\0';
      buffer[6] = '\0';
      buffer[7] = '\0';
      buffer[8] = '\0';
      buffer[9] = '\0';
      buffer[10] = '\0';
      buffer[0xb] = '\0';
      buffer[0xc] = '\0';
      buffer[0xd] = '\0';
      buffer[0xe] = '\0';
      buffer[0xf] = '\0';
      buffer[0x10] = '\x03';
      buffer[0x11] = '\0';
      buffer[0x12] = '\0';
      buffer[0x13] = '\0';
      buffer[0x14] = '\0';
      buffer[0x15] = '\0';
      buffer[0x16] = '\0';
      buffer[0x17] = '\0';
      iVar4 = timerfd_settime(iVar4,0,(itimerspec *)buffer,(itimerspec *)0x0);
      if (iVar4 < 0) {
        fwrite("Fossilize ERROR: Failed to set time with timerfd_settime.\n",0x3a,1,_stderr);
        fflush(_stderr);
      }
      local_60.fd = 0;
      end = (char *)CONCAT44(this->index | 0x80000000,1);
      iVar4 = epoll_ctl(Global::epoll_fd,1,this->timer_fd,(epoll_event *)&end);
      if (iVar4 == 0) {
        return;
      }
      fwrite("Fossilize ERROR: Failed adding timer_fd to epoll_ctl().\n",0x38,1,_stderr);
      fflush(_stderr);
      return;
    }
    fwrite("Fossilize ERROR: Failed to create timerfd. Cannot support timeout for process.\n",0x4f,1
           ,_stderr);
LAB_00124443:
    fflush(_stderr);
    return;
  }
  iVar4 = strncmp(cmd,"GRAPHICS_VERR",0xd);
  if (((iVar4 == 0) || (iVar4 = strncmp(cmd,"RAYTRACE_VERR",0xd), iVar4 == 0)) ||
     (iVar4 = strncmp(cmd,"COMPUTE_VERR",0xc), iVar4 == 0)) {
    pSVar8 = Global::control_block;
    if (Global::control_block == (SharedControlBlock *)0x0) {
      return;
    }
LAB_001241e8:
    buffer[0x30] = '\0';
    buffer[0x31] = '\0';
    buffer[0x32] = '\0';
    buffer[0x33] = '\0';
    buffer[0x34] = '\0';
    buffer[0x35] = '\0';
    buffer[0x36] = '\0';
    buffer[0x37] = '\0';
    buffer[0x38] = '\0';
    buffer[0x39] = '\0';
    buffer[0x3a] = '\0';
    buffer[0x3b] = '\0';
    buffer[0x3c] = '\0';
    buffer[0x3d] = '\0';
    buffer[0x3e] = '\0';
    buffer[0x3f] = '\0';
    buffer[0x20] = '\0';
    buffer[0x21] = '\0';
    buffer[0x22] = '\0';
    buffer[0x23] = '\0';
    buffer[0x24] = '\0';
    buffer[0x25] = '\0';
    buffer[0x26] = '\0';
    buffer[0x27] = '\0';
    buffer[0x28] = '\0';
    buffer[0x29] = '\0';
    buffer[0x2a] = '\0';
    buffer[0x2b] = '\0';
    buffer[0x2c] = '\0';
    buffer[0x2d] = '\0';
    buffer[0x2e] = '\0';
    buffer[0x2f] = '\0';
    buffer[0x10] = '\0';
    buffer[0x11] = '\0';
    buffer[0x12] = '\0';
    buffer[0x13] = '\0';
    buffer[0x14] = '\0';
    buffer[0x15] = '\0';
    buffer[0x16] = '\0';
    buffer[0x17] = '\0';
    buffer[0x18] = '\0';
    buffer[0x19] = '\0';
    buffer[0x1a] = '\0';
    buffer[0x1b] = '\0';
    buffer[0x1c] = '\0';
    buffer[0x1d] = '\0';
    buffer[0x1e] = '\0';
    buffer[0x1f] = '\0';
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    buffer[8] = '\0';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[0xc] = '\0';
    buffer[0xd] = '\0';
    buffer[0xe] = '\0';
    buffer[0xf] = '\0';
    strcpy(buffer,cmd);
    Fossilize::futex_wrapper_lock(&pSVar8->futex_lock);
    pSVar8 = Global::control_block;
    Fossilize::shared_control_block_write(Global::control_block,buffer,size);
  }
  else {
    iVar4 = strncmp(cmd,"GRAPHICS",8);
    if (iVar4 == 0) {
      end = (char *)0x0;
      lVar5 = strtol(cmd + 8,&end,0);
      this->graphics_progress = (int)lVar5;
      if (end == (char *)0x0) {
        return;
      }
      uVar6 = strtoull(end,(char **)0x0,0x10);
      if (Global::control_block == (SharedControlBlock *)0x0) {
        return;
      }
      if (uVar6 == 0 || this->graphics_progress < 1) {
        return;
      }
      uVar7 = (ulong)(this->graphics_progress - 1);
      __format = "GRAPHICS %d %lx\n";
    }
    else {
      iVar4 = strncmp(cmd,"RAYTRACE",8);
      if (iVar4 == 0) {
        end = (char *)0x0;
        lVar5 = strtol(cmd + 8,&end,0);
        this->raytracing_progress = (int)lVar5;
        if (end == (char *)0x0) {
          return;
        }
        uVar6 = strtoull(end,(char **)0x0,0x10);
        if (Global::control_block == (SharedControlBlock *)0x0) {
          return;
        }
        if (uVar6 == 0 || this->raytracing_progress < 1) {
          return;
        }
        uVar7 = (ulong)(this->raytracing_progress - 1);
        __format = "RAYTRACE %d %lx\n";
      }
      else {
        iVar4 = strncmp(cmd,"COMPUTE",7);
        if (iVar4 != 0) {
          iVar4 = strncmp(cmd,"MODULE_UUID",0xb);
          if (iVar4 == 0) {
            uVar1 = *(undefined8 *)(cmd + 0xc);
            uVar2 = *(undefined8 *)(cmd + 0x14);
            uVar3 = *(undefined8 *)(cmd + 0x24);
            *(undefined8 *)(this->module_uuid_path + 0x10) = *(undefined8 *)(cmd + 0x1c);
            *(undefined8 *)(this->module_uuid_path + 0x18) = uVar3;
            *(undefined8 *)this->module_uuid_path = uVar1;
            *(undefined8 *)(this->module_uuid_path + 8) = uVar2;
            return;
          }
          iVar4 = strncmp(cmd,"MODULE",6);
          if (iVar4 != 0) {
            iVar4 = strncmp(cmd,"BEGIN_HEARTBEAT",0xf);
            if (iVar4 == 0) {
              begin_heartbeat(this);
              return;
            }
            iVar4 = strncmp(cmd,"HEARTBEAT",9);
            if (iVar4 == 0) {
              heartbeat(this);
              return;
            }
            fprintf(_stderr,"Fossilize ERROR: Got unexpected message from child: %s\n",cmd);
            goto LAB_00124443;
          }
          buffer._0_8_ = strtoull(cmd + 6,(char **)0x0,0x10);
          std::__detail::
          _Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
          ::insert((_Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                    *)Global::faulty_spirv_modules,(value_type *)buffer);
          pSVar8 = Global::control_block;
          if (Global::control_block == (SharedControlBlock *)0x0) {
            return;
          }
          LOCK();
          (Global::control_block->banned_modules).super___atomic_base<unsigned_int>._M_i =
               (Global::control_block->banned_modules).super___atomic_base<unsigned_int>._M_i + 1;
          UNLOCK();
          goto LAB_001241e8;
        }
        end = (char *)0x0;
        lVar5 = strtol(cmd + 7,&end,0);
        this->compute_progress = (int)lVar5;
        if (end == (char *)0x0) {
          return;
        }
        uVar6 = strtoull(end,(char **)0x0,0x10);
        if (Global::control_block == (SharedControlBlock *)0x0) {
          return;
        }
        if (uVar6 == 0 || this->compute_progress < 1) {
          return;
        }
        uVar7 = (ulong)(this->compute_progress - 1);
        __format = "COMPUTE %d %lx\n";
      }
    }
    sprintf(buffer,__format,uVar7,uVar6);
    Fossilize::futex_wrapper_lock(&Global::control_block->futex_lock);
    pSVar8 = Global::control_block;
    Fossilize::shared_control_block_write(Global::control_block,buffer,size_00);
  }
  Fossilize::futex_wrapper_unlock(&pSVar8->futex_lock);
  return;
}

Assistant:

void ProcessProgress::parse(const char *cmd)
{
	if (strncmp(cmd, "CRASH", 5) == 0)
	{
		// We crashed ... Set up a timeout in case the process hangs while trying to recover.
		close_and_remove_epoll_entry(timer_fd);
		timer_fd = timerfd_create(CLOCK_MONOTONIC, TFD_CLOEXEC);

		if (timer_fd >= 0)
		{
			struct itimerspec spec = {};
			spec.it_value.tv_sec = 3;
			if (timerfd_settime(timer_fd, 0, &spec, nullptr) < 0)
				LOGE("Failed to set time with timerfd_settime.\n");

			struct epoll_event event = {};
			event.data.u32 = 0x80000000u | index;
			event.events = EPOLLIN;
			if (epoll_ctl(Global::epoll_fd, EPOLL_CTL_ADD, timer_fd, &event))
				LOGE("Failed adding timer_fd to epoll_ctl().\n");
		}
		else
			LOGE("Failed to create timerfd. Cannot support timeout for process.\n");
	}
	else if (strncmp(cmd, "GRAPHICS_VERR", 13) == 0 ||
	         strncmp(cmd, "RAYTRACE_VERR", 13) == 0 ||
	         strncmp(cmd, "COMPUTE_VERR", 12) == 0)
	{
		if (Global::control_block)
		{
			// Just forward the message.
			char buffer[ControlBlockMessageSize] = {};
			strcpy(buffer, cmd);

			futex_wrapper_lock(&Global::control_block->futex_lock);
			shared_control_block_write(Global::control_block, buffer, sizeof(buffer));
			futex_wrapper_unlock(&Global::control_block->futex_lock);
		}
	}
	else if (strncmp(cmd, "GRAPHICS", 8) == 0)
	{
		char *end = nullptr;
		graphics_progress = int(strtol(cmd + 8, &end, 0));
		if (end)
		{
			Hash graphics_pipeline = strtoull(end, nullptr, 16);
			// graphics_progress tells us where to start on next iteration, but -1 was actually the pipeline index that crashed.
			if (Global::control_block && graphics_progress > 0 && graphics_pipeline != 0)
			{
				char buffer[ControlBlockMessageSize];
				sprintf(buffer, "GRAPHICS %d %" PRIx64 "\n", graphics_progress - 1, graphics_pipeline);
				futex_wrapper_lock(&Global::control_block->futex_lock);
				shared_control_block_write(Global::control_block, buffer, sizeof(buffer));
				futex_wrapper_unlock(&Global::control_block->futex_lock);
			}
		}
	}
	else if (strncmp(cmd, "RAYTRACE", 8) == 0)
	{
		char *end = nullptr;
		raytracing_progress = int(strtol(cmd + 8, &end, 0));
		if (end)
		{
			Hash raytracing_pipeline = strtoull(end, nullptr, 16);
			// raytracing_progress tells us where to start on next iteration, but -1 was actually the pipeline index that crashed.
			if (Global::control_block && raytracing_progress > 0 && raytracing_pipeline != 0)
			{
				char buffer[ControlBlockMessageSize];
				sprintf(buffer, "RAYTRACE %d %" PRIx64 "\n", raytracing_progress - 1, raytracing_pipeline);
				futex_wrapper_lock(&Global::control_block->futex_lock);
				shared_control_block_write(Global::control_block, buffer, sizeof(buffer));
				futex_wrapper_unlock(&Global::control_block->futex_lock);
			}
		}
	}
	else if (strncmp(cmd, "COMPUTE", 7) == 0)
	{
		char *end = nullptr;
		compute_progress = int(strtol(cmd + 7, &end, 0));
		if (end)
		{
			Hash compute_pipeline = strtoull(end, nullptr, 16);
			// compute_progress tells us where to start on next iteration, but -1 was actually the pipeline index that crashed.
			if (Global::control_block && compute_progress > 0 && compute_pipeline)
			{
				char buffer[ControlBlockMessageSize];
				sprintf(buffer, "COMPUTE %d %" PRIx64 "\n", compute_progress - 1, compute_pipeline);
				futex_wrapper_lock(&Global::control_block->futex_lock);
				shared_control_block_write(Global::control_block, buffer, sizeof(buffer));
				futex_wrapper_unlock(&Global::control_block->futex_lock);
			}
		}
	}
	else if (strncmp(cmd, "MODULE_UUID", 11) == 0)
	{
		memcpy(module_uuid_path, cmd + 12, VK_UUID_SIZE * 2);
	}
	else if (strncmp(cmd, "MODULE", 6) == 0)
	{
		auto hash = strtoull(cmd + 6, nullptr, 16);
		Global::faulty_spirv_modules.insert(hash);

		if (Global::control_block)
		{
			Global::control_block->banned_modules.fetch_add(1, std::memory_order_relaxed);
			char buffer[ControlBlockMessageSize] = {};
			strcpy(buffer, cmd);

			futex_wrapper_lock(&Global::control_block->futex_lock);
			shared_control_block_write(Global::control_block, buffer, sizeof(buffer));
			futex_wrapper_unlock(&Global::control_block->futex_lock);
		}
	}
	else if (strncmp(cmd, "BEGIN_HEARTBEAT", 15) == 0)
	{
		begin_heartbeat();
	}
	else if (strncmp(cmd, "HEARTBEAT", 9) == 0)
	{
		heartbeat();
	}
	else
		LOGE("Got unexpected message from child: %s\n", cmd);
}